

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

int __thiscall
glslang::TParseContext::getIoArrayImplicitSize
          (TParseContext *this,TQualifier *qualifier,TString *featureString)

{
  EShLanguage EVar1;
  TIntermediate *pTVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  uint uVar6;
  TString str;
  pool_allocator<char> local_30;
  
  local_30.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&str,
             "unknown",&local_30);
  pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  iVar4 = pTVar2->vertices;
  if (pTVar2->vertices == -1) {
    iVar4 = 0;
  }
  EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
  if (EVar1 == EShLangTessControl) {
    pcVar5 = "vertices";
LAB_0040d150:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::assign
              (&str,pcVar5);
  }
  else {
    if (EVar1 == EShLangMesh) {
      iVar3 = 0;
      if (pTVar2->primitives != -1) {
        iVar3 = pTVar2->primitives;
      }
      uVar6 = (uint)(*(ulong *)&qualifier->field_0x8 >> 7) & 0x1ff;
      if (2 < uVar6 - 0x89) {
        if (uVar6 == 0x79) {
          iVar4 = TQualifier::mapGeometryToSize(pTVar2->outputPrimitive);
          iVar4 = iVar3 * iVar4;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          assign(&str,"max_primitives*");
          pcVar5 = TQualifier::getGeometryString
                             (((this->super_TParseContextBase).super_TParseVersions.intermediate)->
                              outputPrimitive);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(&str,pcVar5);
          goto LAB_0040d15b;
        }
        if ((*(ulong *)&qualifier->field_0x8 >> 0x29 & 1) == 0) {
          pcVar5 = "max_vertices";
          goto LAB_0040d150;
        }
      }
      pcVar5 = "max_primitives";
    }
    else {
      if (EVar1 == EShLangFragment) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        assign(&str,"vertices");
        iVar4 = 3;
        goto LAB_0040d15b;
      }
      iVar4 = 0;
      if (EVar1 != EShLangGeometry) goto LAB_0040d15b;
      iVar3 = TQualifier::mapGeometryToSize(pTVar2->inputPrimitive);
      pcVar5 = TQualifier::getGeometryString
                         (((this->super_TParseContextBase).super_TParseVersions.intermediate)->
                          inputPrimitive);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::assign
              (&str,pcVar5);
    iVar4 = iVar3;
  }
LAB_0040d15b:
  if (featureString != (TString *)0x0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_assign(featureString,&str);
  }
  return iVar4;
}

Assistant:

int TParseContext::getIoArrayImplicitSize(const TQualifier &qualifier, TString *featureString) const
{
    int expectedSize = 0;
    TString str = "unknown";
    unsigned int maxVertices = intermediate.getVertices() != TQualifier::layoutNotSet ? intermediate.getVertices() : 0;

    if (language == EShLangGeometry) {
        expectedSize = TQualifier::mapGeometryToSize(intermediate.getInputPrimitive());
        str = TQualifier::getGeometryString(intermediate.getInputPrimitive());
    }
    else if (language == EShLangTessControl) {
        expectedSize = maxVertices;
        str = "vertices";
    } else if (language == EShLangFragment) {
        // Number of vertices for Fragment shader is always three.
        expectedSize = 3;
        str = "vertices";
    } else if (language == EShLangMesh) {
        unsigned int maxPrimitives =
            intermediate.getPrimitives() != TQualifier::layoutNotSet ? intermediate.getPrimitives() : 0;
        if (qualifier.builtIn == EbvPrimitiveIndicesNV) {
            expectedSize = maxPrimitives * TQualifier::mapGeometryToSize(intermediate.getOutputPrimitive());
            str = "max_primitives*";
            str += TQualifier::getGeometryString(intermediate.getOutputPrimitive());
        }
        else if (qualifier.builtIn == EbvPrimitiveTriangleIndicesEXT || qualifier.builtIn == EbvPrimitiveLineIndicesEXT ||
                 qualifier.builtIn == EbvPrimitivePointIndicesEXT) {
            expectedSize = maxPrimitives;
            str = "max_primitives";
        }
        else if (qualifier.isPerPrimitive()) {
            expectedSize = maxPrimitives;
            str = "max_primitives";
        }
        else {
            expectedSize = maxVertices;
            str = "max_vertices";
        }
    }
    if (featureString)
        *featureString = str;
    return expectedSize;
}